

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxu.c
# Opt level: O1

int Fxu_FastExtract(Fxu_Data_t *pData)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Fxu_Matrix *p;
  ulong uVar5;
  ulong uVar6;
  Fxu_Double *pDouble;
  Fxu_Single *pSingle;
  Fxu_Double *local_40;
  Fxu_Single *local_38;
  
  s_MemoryTotal = 0;
  s_MemoryPeak = 0;
  p = Fxu_CreateMatrix(pData);
  if (p == (Fxu_Matrix *)0x0) {
    iVar2 = -1;
  }
  else {
    if (pData->fOnlyS == 0) {
      if (pData->fOnlyD == 0) {
        pData->nNodesNew = 0;
        if (pData->fUseCompl == 0) {
          uVar3 = 0;
          do {
            uVar1 = Fxu_HeapSingleReadMaxWeight(p->pHeapSingle);
            uVar4 = Fxu_HeapDoubleReadMaxWeight(p->pHeapDouble);
            if (pData->fVerbose != 0) {
              printf("Div %5d : Best double = %5d. Best single = %5d.%s",(ulong)uVar3,(ulong)uVar4,
                     (ulong)uVar1,"\r");
              uVar3 = uVar3 + 1;
            }
            if ((int)uVar1 < (int)uVar4) {
              if (((int)uVar4 <= pData->WeightMin) && ((uVar4 != 0 || (pData->fUse0 == 0)))) break;
              Fxu_UpdateDouble(p);
            }
            else {
              if (((int)uVar1 <= pData->WeightMin) && ((uVar1 != 0 || (pData->fUse0 == 0)))) break;
              Fxu_UpdateSingle(p);
            }
            iVar2 = pData->nNodesNew + 1;
            pData->nNodesNew = iVar2;
          } while (iVar2 < pData->nNodesExt);
        }
        else {
          uVar5 = 0;
          do {
            uVar3 = Fxu_HeapSingleReadMaxWeight(p->pHeapSingle);
            uVar1 = Fxu_HeapDoubleReadMaxWeight(p->pHeapDouble);
            uVar4 = Fxu_Select(p,&local_38,&local_40);
            uVar6 = uVar5;
            if (pData->fVerbose != 0) {
              uVar6 = (ulong)((int)uVar5 + 1);
              printf("Div %5d : Best double = %5d. Best single = %5d. Best complement = %5d.%s",
                     uVar5,(ulong)uVar1,(ulong)uVar3,(ulong)uVar4,"\r");
            }
            if (((int)uVar4 <= pData->WeightMin) && ((uVar4 != 0 || (pData->fUse0 == 0)))) break;
            Fxu_Update(p,local_38,local_40);
            iVar2 = pData->nNodesNew + 1;
            pData->nNodesNew = iVar2;
            uVar5 = uVar6;
          } while (iVar2 < pData->nNodesExt);
        }
      }
      else {
        pData->nNodesNew = 0;
        uVar3 = 0;
        do {
          uVar1 = Fxu_HeapDoubleReadMaxWeight(p->pHeapDouble);
          if (pData->fVerbose != 0) {
            printf("Div %5d : Best double = %5d.%s",(ulong)uVar3,(ulong)uVar1,"\r");
            uVar3 = uVar3 + 1;
          }
          if (((int)uVar1 <= pData->WeightMin) && ((uVar1 != 0 || (pData->fUse0 == 0)))) break;
          Fxu_UpdateDouble(p);
          iVar2 = pData->nNodesNew + 1;
          pData->nNodesNew = iVar2;
        } while (iVar2 < pData->nNodesExt);
      }
    }
    else {
      pData->nNodesNew = 0;
      uVar3 = 0;
      do {
        uVar1 = Fxu_HeapSingleReadMaxWeight(p->pHeapSingle);
        if (pData->fVerbose != 0) {
          printf("Div %5d : Best single = %5d.%s",(ulong)uVar3,(ulong)uVar1,"\r");
          uVar3 = uVar3 + 1;
        }
        if (((int)uVar1 <= pData->WeightMin) && ((uVar1 != 0 || (pData->fUse0 == 0)))) break;
        Fxu_UpdateSingle(p);
        iVar2 = pData->nNodesNew + 1;
        pData->nNodesNew = iVar2;
      } while (iVar2 < pData->nNodesExt);
    }
    if (pData->fVerbose != 0) {
      printf("Total single = %3d. Total double = %3d. Total compl = %3d.                    \n",
             (ulong)(uint)p->nDivs1,(ulong)(uint)p->nDivs2,(ulong)(uint)p->nDivs3);
    }
    if (pData->nNodesNew != 0) {
      Fxu_CreateCovers(p,pData);
    }
    Fxu_MatrixDelete(p);
    if (pData->nNodesNew == pData->nNodesExt) {
      puts("Warning: The limit on the number of extracted divisors has been reached.");
    }
    iVar2 = pData->nNodesNew;
  }
  return iVar2;
}

Assistant:

int Fxu_FastExtract( Fxu_Data_t * pData )
{
    int fScrollLines = 0;
    Fxu_Matrix * p;
    Fxu_Single * pSingle;
    Fxu_Double * pDouble;
    int Weight1, Weight2, Weight3;
    int Counter = 0;

    s_MemoryTotal = 0;
    s_MemoryPeak  = 0;

    // create the matrix
    p = Fxu_CreateMatrix( pData );
    if ( p == NULL )
        return -1;
//    if ( pData->fVerbose )
//        printf( "Memory usage after construction: Total = %d. Peak = %d.\n", s_MemoryTotal, s_MemoryPeak );
//Fxu_MatrixPrint( NULL, p );

    if ( pData->fOnlyS )
    {
        pData->nNodesNew = 0;
        do
        {
            Weight1 = Fxu_HeapSingleReadMaxWeight( p->pHeapSingle );
            if ( pData->fVerbose )
                printf( "Div %5d : Best single = %5d.%s", Counter++, Weight1, fScrollLines?"\n":"\r" );
            if ( Weight1 > pData->WeightMin || (Weight1 == 0 && pData->fUse0) )
                Fxu_UpdateSingle( p );
            else
                break;
        }
        while ( ++pData->nNodesNew < pData->nNodesExt );
    }
    else if ( pData->fOnlyD )
    {
        pData->nNodesNew = 0;
        do
        {
            Weight2 = Fxu_HeapDoubleReadMaxWeight( p->pHeapDouble );
            if ( pData->fVerbose )
                printf( "Div %5d : Best double = %5d.%s", Counter++, Weight2, fScrollLines?"\n":"\r" );
            if ( Weight2 > pData->WeightMin || (Weight2 == 0 && pData->fUse0) )
                Fxu_UpdateDouble( p );
            else
                break;
        }
        while ( ++pData->nNodesNew < pData->nNodesExt );
    }
    else if ( !pData->fUseCompl )
    {
        pData->nNodesNew = 0;
        do
        {
            Weight1 = Fxu_HeapSingleReadMaxWeight( p->pHeapSingle );
            Weight2 = Fxu_HeapDoubleReadMaxWeight( p->pHeapDouble );

            if ( pData->fVerbose )
                printf( "Div %5d : Best double = %5d. Best single = %5d.%s", Counter++, Weight2, Weight1, fScrollLines?"\n":"\r" );
//Fxu_Select( p, &pSingle, &pDouble );

            if ( Weight1 >= Weight2 )
            {
                if ( Weight1 > pData->WeightMin || (Weight1 == 0 && pData->fUse0) )
                    Fxu_UpdateSingle( p );
                else
                    break;
            }
            else
            {
                if ( Weight2 > pData->WeightMin || (Weight2 == 0 && pData->fUse0) )
                    Fxu_UpdateDouble( p );
                else
                    break;
            }
        }
        while ( ++pData->nNodesNew < pData->nNodesExt );
    }
    else
    { // use the complement
        pData->nNodesNew = 0;
        do
        {
            Weight1 = Fxu_HeapSingleReadMaxWeight( p->pHeapSingle );
            Weight2 = Fxu_HeapDoubleReadMaxWeight( p->pHeapDouble );

            // select the best single and double
            Weight3 = Fxu_Select( p, &pSingle, &pDouble );
            if ( pData->fVerbose )
                printf( "Div %5d : Best double = %5d. Best single = %5d. Best complement = %5d.%s", 
                    Counter++, Weight2, Weight1, Weight3, fScrollLines?"\n":"\r" );

            if ( Weight3 > pData->WeightMin || (Weight3 == 0 && pData->fUse0) )
                Fxu_Update( p, pSingle, pDouble );
            else
                break;
        }
        while ( ++pData->nNodesNew < pData->nNodesExt );
    }

    if ( pData->fVerbose )
        printf( "Total single = %3d. Total double = %3d. Total compl = %3d.                    \n", 
        p->nDivs1, p->nDivs2, p->nDivs3 );

    // create the new covers
    if ( pData->nNodesNew )
        Fxu_CreateCovers( p, pData );
    Fxu_MatrixDelete( p );
//    printf( "Memory usage after deallocation:   Total = %d. Peak = %d.\n", s_MemoryTotal, s_MemoryPeak );
    if ( pData->nNodesNew == pData->nNodesExt )
        printf( "Warning: The limit on the number of extracted divisors has been reached.\n" );
    return pData->nNodesNew;
}